

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O1

void testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>
               (Array<wasm::analysis::Bool,_2UL> *lattice,Element *bot,Element *a,Element *b,
               Element *top)

{
  Array<wasm::analysis::Bool,_2UL> *local_38;
  anon_class_8_1_809a3e96 test;
  
  local_38 = lattice;
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,bot,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,a,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,b,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,top,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,bot,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,a,a);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,b,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,top,a);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,bot,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,a,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,b,b);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,top,b);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,bot,bot);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,a,a);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,b,b);
  testDiamondMeet<wasm::analysis::Array<wasm::analysis::Bool,2ul>>(wasm::analysis::Array<wasm::analysis::Bool,2ul>const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&,wasm::analysis::Array<wasm::analysis::Bool,2ul>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,top,top);
  return;
}

Assistant:

void testDiamondMeet(const L& lattice,
                     const typename L::Element& bot,
                     const typename L::Element& a,
                     const typename L::Element& b,
                     const typename L::Element& top) {
  auto test =
    [&](const auto& meetee, const auto& meeter, const auto& expected) {
      auto copy = meetee;
      EXPECT_EQ(lattice.meet(copy, meeter), meetee != expected);
      EXPECT_EQ(copy, expected);
    };

  test(bot, bot, bot);
  test(bot, a, bot);
  test(bot, b, bot);
  test(bot, top, bot);

  test(a, bot, bot);
  test(a, a, a);
  test(a, b, bot);
  test(a, top, a);

  test(b, bot, bot);
  test(b, a, bot);
  test(b, b, b);
  test(b, top, b);

  test(top, bot, bot);
  test(top, a, a);
  test(top, b, b);
  test(top, top, top);
}